

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_color_pick(nk_context *ctx,nk_colorf *color,nk_color_format fmt)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  nk_window *pnVar8;
  nk_panel *pnVar9;
  nk_user_font *pnVar10;
  nk_widget_layout_states nVar11;
  int iVar12;
  nk_color top;
  float *pfVar13;
  long lVar14;
  void *pvVar15;
  undefined2 uVar16;
  uint uVar17;
  nk_command_buffer *b;
  nk_widget_layout_states nVar18;
  nk_flags *state;
  nk_context *i;
  float fVar19;
  float fVar20;
  float fVar21;
  float s;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  nk_rect r;
  nk_rect r_00;
  nk_rect r_01;
  nk_colorf nVar33;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  float V;
  nk_rect bounds;
  undefined8 local_178;
  uint local_168;
  undefined8 local_158;
  nk_rect local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  float local_38;
  float local_34;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ee1,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  if (color == (nk_colorf *)0x0) {
    __assert_fail("color",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ee2,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  pnVar8 = ctx->current;
  if (pnVar8 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ee3,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  pnVar9 = pnVar8->layout;
  if (pnVar9 != (nk_panel *)0x0) {
    nVar11 = nk_widget(&local_98,ctx);
    if (nVar11 != NK_WIDGET_INVALID) {
      i = (nk_context *)0x0;
      if ((nVar11 != NK_WIDGET_ROM) && ((pnVar9->flags & 0x1000) == 0)) {
        i = ctx;
      }
      pnVar10 = (ctx->style).font;
      if (pnVar10 == (nk_user_font *)0x0) {
        __assert_fail("font",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x5eb7,
                      "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_colorf *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      fVar22 = local_98.x;
      fVar26 = local_98.y;
      fVar20 = pnVar10->height;
      fVar28 = fVar22 + 0.0;
      fVar23 = fVar26 + 0.0;
      fVar19 = fVar20 + fVar20 + 0.0;
      fVar27 = local_98.w;
      fVar32 = local_98.h;
      fVar21 = fVar27 - fVar19;
      fVar31 = fVar28 + fVar21;
      local_38 = fVar20 + fVar31;
      local_48 = ZEXT416((uint)local_38);
      nVar18 = NK_WIDGET_INVALID;
      pfVar13 = &local_38;
      if (fmt != NK_RGBA) {
        pfVar13 = (float *)0x0;
      }
      uVar2 = color->r;
      uVar5 = color->g;
      local_68._0_4_ = color->b;
      local_68._4_4_ = color->a;
      uStack_60 = 0;
      local_88 = (float)uVar5;
      local_58 = local_68;
      if ((float)uVar5 < (float)local_68) {
        local_58 = CONCAT44(local_68._4_4_,uVar5);
        local_88 = (float)local_68;
      }
      state = &ctx->last_widget_state;
      rect_02.w = fVar27 - fVar19;
      rect_02.h = fVar32;
      fVar19 = (float)uVar2;
      local_78 = local_88;
      if ((float)uVar2 < local_88) {
        fVar19 = local_88;
        local_78 = (float)uVar2;
      }
      rect_00.h = fVar32;
      rect_00.w = fVar20;
      fVar24 = local_78;
      if ((float)local_58 <= local_78) {
        fVar24 = (float)local_58;
      }
      fVar24 = fVar19 - fVar24;
      uStack_50 = 0;
      fVar30 = (float)((ulong)local_58 >> 0x20);
      r.y = fVar23;
      r.x = fVar28;
      r.w = rect_02.w;
      r.h = fVar32;
      fStack_84 = local_88;
      fStack_80 = local_88;
      fStack_7c = local_88;
      fStack_74 = local_78;
      fStack_70 = local_78;
      fStack_6c = local_78;
      local_34 = fVar23;
      iVar12 = nk_button_behavior(state,r,&i->input,NK_BUTTON_REPEATER);
      if (iVar12 == 0) {
        s = fVar24 / (fVar19 + 1e-20);
      }
      else {
        fVar29 = ((i->input).mouse.pos.x - fVar28) / (fVar21 + -1.0);
        s = (float)(-(uint)(1.0 < fVar29) & 0x3f800000 |
                   ~-(uint)(1.0 < fVar29) & -(uint)(0.0 < fVar29) & 0x3f800000);
        fVar19 = fVar29;
        if (fVar29 <= 0.0) {
          fVar19 = s;
        }
        if (fVar29 <= 1.0) {
          s = fVar19;
        }
        fVar25 = ((i->input).mouse.pos.y - fVar23) / (fVar32 + -1.0);
        fVar19 = (float)(-(uint)(1.0 < fVar25) & 0x3f800000 |
                        ~-(uint)(1.0 < fVar25) & -(uint)(0.0 < fVar25) & 0x3f800000);
        fVar29 = fVar25;
        if (fVar25 <= 0.0) {
          fVar29 = fVar19;
        }
        if (fVar25 <= 1.0) {
          fVar19 = fVar29;
        }
        fVar19 = 1.0 - fVar19;
        nVar18 = NK_WIDGET_VALID;
      }
      r_00.w = fVar20;
      r_00.h = fVar32;
      r_00.x = fVar31;
      r_00.y = fVar23;
      iVar12 = nk_button_behavior(state,r_00,&i->input,NK_BUTTON_REPEATER);
      if (iVar12 == 0) {
        fVar29 = (float)(-(uint)((float)uVar5 < (float)local_68) & 0xbf800000);
        fVar29 = (local_78 - (float)local_58) / (fVar24 * 6.0 + 1e-20) +
                 (float)(~-(uint)((float)uVar2 < local_88) & (uint)fVar29 |
                        (uint)(-0.33333334 - fVar29) & -(uint)((float)uVar2 < local_88));
        fVar24 = -fVar29;
        if (-fVar29 <= fVar29) {
          fVar24 = fVar29;
        }
      }
      else {
        fVar25 = ((i->input).mouse.pos.y - fVar23) / (fVar32 + -1.0);
        fVar24 = (float)(-(uint)(1.0 < fVar25) & 0x3f800000 |
                        ~-(uint)(1.0 < fVar25) & -(uint)(0.0 < fVar25) & 0x3f800000);
        fVar29 = fVar25;
        if (fVar25 <= 0.0) {
          fVar29 = fVar24;
        }
        if (fVar25 <= 1.0) {
          fVar24 = fVar29;
        }
        nVar18 = NK_WIDGET_VALID;
      }
      nVar11 = nVar18;
      if ((fmt == NK_RGBA) &&
         (r_01.w = fVar20, r_01.h = fVar32, r_01.x = pfVar13[0], r_01.y = pfVar13[1],
         iVar12 = nk_button_behavior(state,r_01,&i->input,NK_BUTTON_REPEATER), iVar12 != 0)) {
        fVar25 = ((i->input).mouse.pos.y - fVar23) / (fVar32 + -1.0);
        fVar30 = (float)(-(uint)(1.0 < fVar25) & 0x3f800000 |
                        ~-(uint)(1.0 < fVar25) & -(uint)(0.0 < fVar25) & 0x3f800000);
        fVar29 = fVar25;
        if (fVar25 <= 0.0) {
          fVar29 = fVar30;
        }
        if (fVar25 <= 1.0) {
          fVar30 = fVar29;
        }
        fVar30 = 1.0 - fVar30;
        nVar11 = NK_WIDGET_VALID;
      }
      *state = *state & 2 | 4;
      if (nVar18 != NK_WIDGET_INVALID) {
        nVar33 = nk_hsva_colorf(fVar24,s,fVar19,fVar30);
        *color = nVar33;
        *state = 0x22;
      }
      if (nVar11 != NK_WIDGET_INVALID) {
        color->a = fVar30;
        *state = 0x22;
      }
      if ((((i != (nk_context *)0x0) && (fVar19 = (i->input).mouse.pos.x, fVar22 <= fVar19)) &&
          (fVar19 < fVar28 + fVar27)) &&
         ((fVar19 = (i->input).mouse.pos.y, fVar26 <= fVar19 && (fVar19 < fVar23 + fVar32)))) {
        *state = 0x12;
      }
      if ((((*state & 0x10) != 0) &&
          (((uVar17 = 8, i == (nk_context *)0x0 ||
            (fVar19 = (i->input).mouse.prev.x, fVar19 < fVar22)) ||
           ((fVar28 + fVar27 <= fVar19 ||
            ((fVar19 = (i->input).mouse.prev.y, fVar19 < fVar26 || (fVar23 + fVar32 <= fVar19)))))))
          ) || ((i != (nk_context *)0x0 &&
                ((((fVar19 = (i->input).mouse.prev.x, fVar22 <= fVar19 && (fVar19 < fVar27 + fVar28)
                   ) && (fVar19 = (i->input).mouse.prev.y, fVar26 <= fVar19)) &&
                 (uVar17 = 0x40, fVar19 < fVar23 + fVar32)))))) {
        *state = *state | uVar17;
      }
      uVar3 = color->r;
      uVar6 = color->g;
      uVar4 = color->b;
      uVar7 = color->a;
      fVar19 = (float)uVar6;
      fVar22 = (float)uVar4;
      if ((float)uVar4 <= (float)uVar6) {
        fVar19 = (float)uVar4;
        fVar22 = (float)uVar6;
      }
      fVar26 = fVar22;
      fVar27 = (float)uVar3;
      if (fVar22 <= (float)uVar3) {
        fVar26 = (float)uVar3;
        fVar27 = fVar22;
      }
      b = &pnVar8->buffer;
      local_168 = -(uint)((float)uVar6 < (float)uVar4) & 0xbf800000;
      fVar24 = fVar27;
      if (fVar19 <= fVar27) {
        fVar24 = fVar19;
      }
      lVar14 = 0;
      do {
        lVar1 = lVar14 + 1;
        rect.y = (float)(int)lVar14 * (fVar32 / 6.0) + fVar23 + 0.5;
        rect.x = fVar31;
        rect.w = fVar20;
        rect.h = fVar32 / 6.0 + 0.5;
        nk_fill_rect_multi_color
                  (b,rect,*(nk_color *)(&nk_draw_color_picker_hue_colors + lVar14),
                   *(nk_color *)(&nk_draw_color_picker_hue_colors + lVar14),
                   *(nk_color *)(&DAT_00163664 + lVar14),*(nk_color *)(&DAT_00163664 + lVar14));
        lVar14 = lVar1;
      } while (lVar1 != 6);
      fVar22 = (float)(~-(uint)((float)uVar3 < fVar22) & local_168 |
                      (uint)(-0.33333334 -
                            (float)(-(uint)((float)uVar6 < (float)uVar4) & 0xbf800000)) &
                      -(uint)((float)uVar3 < fVar22)) +
               (fVar27 - fVar19) / ((fVar26 - fVar24) * 6.0 + 1e-20);
      fVar19 = -fVar22;
      if (-fVar22 <= fVar22) {
        fVar19 = fVar22;
      }
      pvVar15 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar15 != (void *)0x0) {
        *(undefined2 *)((long)pvVar15 + 0x10) = 1;
        *(short *)((long)pvVar15 + 0x12) = (short)(int)(fVar31 + -1.0);
        uVar16 = (undefined2)(int)(fVar19 * fVar32 + fVar23 + 0.5);
        *(undefined2 *)((long)pvVar15 + 0x14) = uVar16;
        *(short *)((long)pvVar15 + 0x16) = (short)(int)((float)local_48._0_4_ + 2.0);
        *(undefined2 *)((long)pvVar15 + 0x18) = uVar16;
        *(undefined4 *)((long)pvVar15 + 0x1a) = 0xffffffff;
      }
      if (fmt == NK_RGBA) {
        rect_00.x = pfVar13[0];
        rect_00.y = pfVar13[1];
        nk_fill_rect_multi_color
                  (b,rect_00,(nk_color)0xffffffff,(nk_color)0xffffffff,(nk_color)0xff000000,
                   (nk_color)0xff000000);
        fVar22 = *pfVar13;
        pvVar15 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
        if (pvVar15 != (void *)0x0) {
          fVar31 = 1.0;
          if ((float)uVar7 <= 1.0) {
            fVar31 = (float)uVar7;
          }
          if (fVar31 <= 0.0) {
            fVar31 = 0.0;
          }
          *(undefined2 *)((long)pvVar15 + 0x10) = 1;
          *(short *)((long)pvVar15 + 0x12) = (short)(int)(fVar22 + -1.0);
          uVar16 = (undefined2)(int)((1.0 - fVar31) * fVar32 + fVar23 + 0.5);
          *(undefined2 *)((long)pvVar15 + 0x14) = uVar16;
          *(short *)((long)pvVar15 + 0x16) = (short)(int)(fVar20 + fVar22 + 2.0);
          *(undefined2 *)((long)pvVar15 + 0x18) = uVar16;
          *(undefined4 *)((long)pvVar15 + 0x1a) = 0xffffffff;
        }
      }
      nVar33 = nk_hsva_colorf(fVar19,1.0,1.0,1.0);
      top = nk_rgba_f(nVar33.r,nVar33.g,nVar33.b,nVar33.a);
      rect_01.y = fVar23;
      rect_01.x = fVar28;
      rect_01.w = rect_02.w;
      rect_01.h = fVar32;
      nk_fill_rect_multi_color(b,rect_01,(nk_color)0xffffffff,top,top,(nk_color)0xffffffff);
      rect_02.y = fVar23;
      rect_02.x = fVar28;
      nk_fill_rect_multi_color
                (b,rect_02,(nk_color)0x0,(nk_color)0x0,(nk_color)0xff000000,(nk_color)0xff000000);
      fVar28 = ((fVar26 - fVar24) / (fVar26 + 1e-20)) * fVar21 + fVar28;
      fVar20 = (float)(int)fVar28;
      fVar23 = (1.0 - fVar26) * fVar32 + fVar23;
      pvVar15 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      uVar16 = (undefined2)(int)fVar23;
      if (pvVar15 != (void *)0x0) {
        *(undefined2 *)((long)pvVar15 + 0x10) = 1;
        *(short *)((long)pvVar15 + 0x12) = (short)(int)(fVar20 + -7.0);
        *(undefined2 *)((long)pvVar15 + 0x14) = uVar16;
        *(short *)((long)pvVar15 + 0x16) = (short)(int)(fVar20 + -2.0);
        *(undefined2 *)((long)pvVar15 + 0x18) = uVar16;
        *(undefined4 *)((long)pvVar15 + 0x1a) = 0xffffffff;
      }
      fVar19 = (float)(int)fVar23;
      pvVar15 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar15 != (void *)0x0) {
        *(undefined2 *)((long)pvVar15 + 0x10) = 1;
        *(short *)((long)pvVar15 + 0x12) = (short)(int)(fVar20 + 7.0 + 1.0);
        *(undefined2 *)((long)pvVar15 + 0x14) = uVar16;
        *(short *)((long)pvVar15 + 0x16) = (short)(int)(fVar20 + 3.0);
        *(undefined2 *)((long)pvVar15 + 0x18) = uVar16;
        *(undefined4 *)((long)pvVar15 + 0x1a) = 0xffffffff;
      }
      pvVar15 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      uVar16 = (undefined2)(int)fVar28;
      if (pvVar15 != (void *)0x0) {
        *(undefined2 *)((long)pvVar15 + 0x10) = 1;
        *(undefined2 *)((long)pvVar15 + 0x12) = uVar16;
        *(short *)((long)pvVar15 + 0x14) = (short)(int)(fVar19 + 7.0 + 1.0);
        *(undefined2 *)((long)pvVar15 + 0x16) = uVar16;
        *(short *)((long)pvVar15 + 0x18) = (short)(int)(fVar19 + 3.0);
        *(undefined4 *)((long)pvVar15 + 0x1a) = 0xffffffff;
      }
      pvVar15 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar15 != (void *)0x0) {
        *(undefined2 *)((long)pvVar15 + 0x10) = 1;
        *(undefined2 *)((long)pvVar15 + 0x12) = uVar16;
        *(short *)((long)pvVar15 + 0x14) = (short)(int)(fVar19 + -7.0);
        *(undefined2 *)((long)pvVar15 + 0x16) = uVar16;
        *(short *)((long)pvVar15 + 0x18) = (short)(int)(fVar19 + -2.0);
        *(undefined4 *)((long)pvVar15 + 0x1a) = 0xffffffff;
      }
    }
    return nVar11;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x5ee4,
                "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)");
}

Assistant:

NK_API int
nk_color_pick(struct nk_context * ctx, struct nk_colorf *color,
    enum nk_color_format fmt)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *config;
    const struct nk_input *in;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(color);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !color)
        return 0;

    win = ctx->current;
    config = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_color_picker(&ctx->last_widget_state, &win->buffer, color, fmt, bounds,
                nk_vec2(0,0), in, config->font);
}